

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O2

uint __thiscall
Memory::HeapBlockMap64::Rescan(HeapBlockMap64 *this,Recycler *recycler,bool resetWriteWatch)

{
  HeapBlockMap64 HVar1;
  uint uVar2;
  uint scannedPageCount;
  uint uVar3;
  
  uVar3 = 0;
  while (HVar1.list = this->list, HVar1.list != (Node *)0x0) {
    uVar2 = HeapBlockMap32::Rescan(&(HVar1.list)->map,recycler,false);
    uVar3 = uVar3 + uVar2;
    this = (HeapBlockMap64 *)&(HVar1.list)->next;
  }
  return uVar3;
}

Assistant:

uint
HeapBlockMap64::Rescan(Recycler * recycler, bool resetWriteWatch)
{
    uint scannedPageCount = 0;

    Node * node = this->list;
    while (node != nullptr)
    {
        scannedPageCount += node->map.Rescan(recycler, resetWriteWatch);
        node = node->next;
    }

    return scannedPageCount;
}